

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_26ae32c::ConditionStack::toggle_top(ConditionStack *this)

{
  long lVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_stack_size == 0) {
    __assert_fail("m_stack_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/interpreter.cpp"
                  ,0x131,"void (anonymous namespace)::ConditionStack::toggle_top()");
  }
  uVar2 = this->m_stack_size - 1;
  if ((this->m_first_false_pos == 0xffffffff) ||
     (bVar3 = this->m_first_false_pos == uVar2, uVar2 = 0xffffffff, bVar3)) {
    this->m_first_false_pos = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void toggle_top()
    {
        assert(m_stack_size > 0);
        if (m_first_false_pos == NO_FALSE) {
            // The current stack is all true values; the first false will be the top.
            m_first_false_pos = m_stack_size - 1;
        } else if (m_first_false_pos == m_stack_size - 1) {
            // The top is the first false value; toggling it will make everything true.
            m_first_false_pos = NO_FALSE;
        } else {
            // There is a false value, but not on top. No action is needed as toggling
            // anything but the first false value is unobservable.
        }
    }